

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatVehicle.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatVehicle::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedGroundCombatVehicle *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GED_EnhancedGroundCombatVehicle *local_18;
  GED_EnhancedGroundCombatVehicle *this_local;
  
  local_18 = this;
  this_local = (GED_EnhancedGroundCombatVehicle *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GED_BasicGroundCombatVehicle::GetAsString_abi_cxx11_
            (&local_1c0,&this->super_GED_BasicGroundCombatVehicle);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190,"GED Enhanced Ground Combat Vehicle\n");
  poVar1 = std::operator<<(poVar1,"\tFuel Status:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8FuelStatus);
  poVar1 = std::operator<<(poVar1,"0 Litres\n");
  poVar1 = std::operator<<(poVar1,"\tGround Maintenance Status: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8GrndMaintStatus);
  poVar1 = std::operator<<(poVar1,"0 km\n");
  poVar1 = std::operator<<(poVar1,"\tPrimary Ammunition:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8PriAmmun);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSecondary Ammunition:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SecAmmun);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedGroundCombatVehicle::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicGroundCombatVehicle::GetAsString();

    ss << "GED Enhanced Ground Combat Vehicle\n"
       << "\tFuel Status:               " << ( KUINT16 )m_ui8FuelStatus      << "0 Litres\n"
       << "\tGround Maintenance Status: " << ( KUINT16 )m_ui8GrndMaintStatus << "0 km\n"
       << "\tPrimary Ammunition:        " << ( KUINT16 )m_ui8PriAmmun        << "\n"
       << "\tSecondary Ammunition:      " << ( KUINT16 )m_ui8SecAmmun        << "\n";

    return ss.str();
}